

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_set_infinity(secp256k1_gej *r)

{
  r->infinity = 1;
  secp256k1_fe_set_int(&r->x,0);
  secp256k1_fe_set_int(&r->y,0);
  secp256k1_fe_set_int(&r->z,0);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_set_infinity(secp256k1_gej *r) {
    r->infinity = 1;
    secp256k1_fe_set_int(&r->x, 0);
    secp256k1_fe_set_int(&r->y, 0);
    secp256k1_fe_set_int(&r->z, 0);

    SECP256K1_GEJ_VERIFY(r);
}